

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_sequence_args(t_text_sequence *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined4 uVar1;
  t_atom *ptVar2;
  t_atom *ptVar3;
  int local_2c;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_text_sequence *x_local;
  
  ptVar2 = (t_atom *)resizebytes(x->x_argv,(long)x->x_argc << 4,(long)argc << 4);
  x->x_argv = ptVar2;
  for (local_2c = 0; local_2c < argc; local_2c = local_2c + 1) {
    ptVar2 = x->x_argv + local_2c;
    ptVar3 = argv + local_2c;
    uVar1 = *(undefined4 *)&ptVar3->field_0x4;
    ptVar2->a_type = ptVar3->a_type;
    *(undefined4 *)&ptVar2->field_0x4 = uVar1;
    ptVar2->a_w = ptVar3->a_w;
  }
  x->x_argc = argc;
  return;
}

Assistant:

static void text_sequence_args(t_text_sequence *x, t_symbol *s,
    int argc, t_atom *argv)
{
    int i;
    x->x_argv = t_resizebytes(x->x_argv,
        x->x_argc * sizeof(t_atom), argc * sizeof(t_atom));
    for (i = 0; i < argc; i++)
        x->x_argv[i] = argv[i];
    x->x_argc = argc;
}